

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

uint rtosc_narguments(char *msg)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  
  pcVar1 = rtosc_argument_string(msg);
  cVar3 = *pcVar1;
  uVar2 = 0;
  while (pcVar1 = pcVar1 + 1, cVar3 != '\0') {
    cVar3 = *pcVar1;
    uVar2 = (uVar2 + 1) - (uint)((cVar3 + 0xa5U & 0xfd) == 0);
  }
  return uVar2;
}

Assistant:

unsigned rtosc_narguments(const char *msg)
{
    const char *args = rtosc_argument_string(msg);
    int nargs = 0;
    while(*args++)
        nargs += (*args == ']' || *args == '[') ? 0 : 1;
    return nargs;
}